

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall Minisat::DoubleOption::help(DoubleOption *this,bool verbose)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined7 in_register_00000031;
  
  uVar1 = 0x28;
  if ((this->range).begin_inclusive != false) {
    uVar1 = 0x5b;
  }
  uVar2 = 0x29;
  if ((this->range).end_inclusive != false) {
    uVar2 = 0x5d;
  }
  fprintf(_stderr,"  -%-12s = %-8s %c%4.2g .. %4.2g%c (default: %g)\n",(this->range).begin,
          (this->range).end,this->value,(this->super_Option).name,(this->super_Option).type_name,
          uVar1,uVar2);
  if ((int)CONCAT71(in_register_00000031,verbose) == 0) {
    return;
  }
  fprintf(_stderr,"\n        %s\n",(this->super_Option).description);
  fputc(10,_stderr);
  return;
}

Assistant:

virtual void help (bool verbose = false){
        fprintf(stderr, "  -%-12s = %-8s %c%4.2g .. %4.2g%c (default: %g)\n", 
                name, type_name, 
                range.begin_inclusive ? '[' : '(', 
                range.begin,
                range.end,
                range.end_inclusive ? ']' : ')', 
                value);
        if (verbose){
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }